

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

baseHolder * __thiscall cs_impl::any::holder<cs::pointer>::duplicate(holder<cs::pointer> *this)

{
  holder<cs::pointer> *phVar1;
  pointer *in_stack_00000008;
  allocator_type<cs_impl::any::holder<cs::pointer>,_64UL,_cs_impl::default_allocator_provider>
  *in_stack_00000010;
  
  phVar1 = cs::
           allocator_type<cs_impl::any::holder<cs::pointer>,64ul,cs_impl::default_allocator_provider>
           ::alloc<cs::pointer&>(in_stack_00000010,in_stack_00000008);
  return &phVar1->super_baseHolder;
}

Assistant:

baseHolder *duplicate() override
			{
				return allocator.alloc(mDat);
			}